

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_style_load_all_cursors(nk_context *ctx,nk_cursor *cursors)

{
  long lVar1;
  
  if (ctx != (nk_context *)0x0) {
    lVar1 = 0;
    do {
      (ctx->style).cursors[lVar1] = cursors;
      lVar1 = lVar1 + 1;
      cursors = cursors + 1;
    } while (lVar1 != 7);
    (ctx->style).cursor_visible = 1;
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x3de6,"void nk_style_load_all_cursors(struct nk_context *, struct nk_cursor *)");
}

Assistant:

NK_API void
nk_style_load_all_cursors(struct nk_context *ctx, struct nk_cursor *cursors)
{
    int i = 0;
    struct nk_style *style;
    NK_ASSERT(ctx);
    if (!ctx) return;
    style = &ctx->style;
    for (i = 0; i < NK_CURSOR_COUNT; ++i)
        style->cursors[i] = &cursors[i];
    style->cursor_visible = nk_true;
}